

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# image.cpp
# Opt level: O1

Image * __thiscall
pbrt::Image::Crop(Image *__return_storage_ptr__,Image *this,Bounds2i *bounds,Allocator alloc)

{
  uint uVar1;
  int iVar2;
  int iVar3;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar4;
  bool bVar5;
  bool bVar6;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar7;
  Point2i resolution;
  int iVar8;
  int iVar9;
  Point2i p;
  int iVar10;
  uint uVar11;
  Tuple2<pbrt::Point2,_int> p_00;
  ulong uVar12;
  Float value;
  span<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  channels;
  int vb;
  int va;
  TaggedPointer<pbrt::LinearColorEncoding,_pbrt::sRGBColorEncoding,_pbrt::GammaColorEncoding>
  local_38;
  
  uVar11 = (bounds->pMin).super_Tuple2<pbrt::Point2,_int>.x;
  uVar1 = (bounds->pMin).super_Tuple2<pbrt::Point2,_int>.y;
  iVar10 = (bounds->pMax).super_Tuple2<pbrt::Point2,_int>.x - uVar11;
  va = ((bounds->pMax).super_Tuple2<pbrt::Point2,_int>.y - uVar1) * iVar10;
  vb = 0;
  if (va < 1) {
    LogFatal<char_const(&)[14],char_const(&)[2],char_const(&)[14],int&,char_const(&)[2],int&>
              (Fatal,
               "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/pbrt/util/image.cpp"
               ,0x54a,"Check failed: %s > %s with %s = %s, %s = %s",(char (*) [14])"bounds.Area()",
               (char (*) [2])0x2d2665d,(char (*) [14])"bounds.Area()",&va,(char (*) [2])0x2d2665d,
               &vb);
  }
  if ((int)(uVar11 | uVar1) < 0) {
    LogFatal<char_const(&)[41]>
              (Fatal,
               "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/pbrt/util/image.cpp"
               ,0x54b,"Check failed: %s",(char (*) [41])"bounds.pMin.x >= 0 && bounds.pMin.y >= 0");
  }
  pbVar4 = (this->channelNames).ptr;
  pbVar7 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
           &(this->channelNames).field_2;
  if (pbVar4 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    pbVar7 = pbVar4;
  }
  local_38.bits =
       (this->encoding).
       super_TaggedPointer<pbrt::LinearColorEncoding,_pbrt::sRGBColorEncoding,_pbrt::GammaColorEncoding>
       .bits;
  resolution.super_Tuple2<pbrt::Point2,_int>.y =
       (bounds->pMax).super_Tuple2<pbrt::Point2,_int>.y - uVar1;
  resolution.super_Tuple2<pbrt::Point2,_int>.x = iVar10;
  channels.n = (this->channelNames).nStored;
  channels.ptr = pbVar7;
  Image(__return_storage_ptr__,this->format,resolution,channels,(ColorEncodingHandle *)&local_38,
        alloc);
  p_00 = (bounds->pMin).super_Tuple2<pbrt::Point2,_int>;
  iVar10 = (bounds->pMax).super_Tuple2<pbrt::Point2,_int>.y;
  iVar9 = (bounds->pMin).super_Tuple2<pbrt::Point2,_int>.x;
  bVar5 = (bounds->pMax).super_Tuple2<pbrt::Point2,_int>.x <= iVar9;
  bVar6 = iVar10 <= (bounds->pMin).super_Tuple2<pbrt::Point2,_int>.y;
  uVar12 = (ulong)p_00 >> 0x20;
  iVar8 = p_00.y;
  if (bVar5 || bVar6) {
    iVar10 = iVar8;
  }
  if (bVar5 || bVar6) {
    iVar9 = p_00.x;
  }
  if (iVar9 != p_00.x) goto LAB_002736c8;
  while (iVar10 != iVar8) {
LAB_002736c8:
    do {
      if (0 < (int)(this->channelNames).nStored) {
        iVar8 = 0;
        do {
          iVar2 = (bounds->pMin).super_Tuple2<pbrt::Point2,_int>.x;
          iVar3 = (bounds->pMin).super_Tuple2<pbrt::Point2,_int>.y;
          value = GetChannel(this,(Point2i)p_00,iVar8,(WrapMode2D)0x200000002);
          p.super_Tuple2<pbrt::Point2,_int>.x = p_00.x - iVar2;
          p.super_Tuple2<pbrt::Point2,_int>.y = (int)uVar12 - iVar3;
          SetChannel(__return_storage_ptr__,p,iVar8,value);
          iVar8 = iVar8 + 1;
        } while (iVar8 < (int)(this->channelNames).nStored);
      }
      uVar11 = p_00.x + 1;
      uVar12 = (ulong)p_00 & 0xffffffff00000000;
      p_00 = (Tuple2<pbrt::Point2,_int>)
             (uVar12 + 0x100000000 + (ulong)(uint)(bounds->pMin).super_Tuple2<pbrt::Point2,_int>.x);
      if (uVar11 != (bounds->pMax).super_Tuple2<pbrt::Point2,_int>.x) {
        p_00 = (Tuple2<pbrt::Point2,_int>)(uVar12 | uVar11);
      }
      uVar12 = (ulong)p_00 >> 0x20;
    } while (iVar9 != p_00.x);
    iVar8 = p_00.y;
  }
  return __return_storage_ptr__;
}

Assistant:

Image Image::Crop(const Bounds2i &bounds, Allocator alloc) const {
    CHECK_GT(bounds.Area(), 0);
    CHECK(bounds.pMin.x >= 0 && bounds.pMin.y >= 0);
    Image image(format, Point2i(bounds.pMax - bounds.pMin), channelNames, encoding,
                alloc);
    for (Point2i p : bounds)
        for (int c = 0; c < NChannels(); ++c)
            image.SetChannel(Point2i(p - bounds.pMin), c, GetChannel(p, c));
    return image;
}